

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mul.h
# Opt level: O0

LinTerms * __thiscall
mp::
QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
::LinearizeGeneralProduct
          (QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
           *this,double c,int x,int y)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  Var VVar1;
  Var VVar2;
  Arguments args;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  LinTerms *this_01;
  undefined4 in_ECX;
  undefined4 in_EDX;
  LinTerms *in_RSI;
  LinTerms *in_RDI;
  Var y_pow2;
  Var x_pow2;
  Var x_plus_y_pow2;
  Var x_plus_y;
  LinTerms *lt;
  AffineExpr *in_stack_fffffffffffffc38;
  LinearFunctionalConstraint *in_stack_fffffffffffffc40;
  int iVar3;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  AlgebraicExpression<mp::LinTerms> *in_stack_fffffffffffffc50;
  Parameters in_stack_fffffffffffffc58;
  Parameters prm;
  undefined4 in_stack_fffffffffffffc60;
  Arguments in_stack_fffffffffffffc64;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffc68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  size_type in_stack_fffffffffffffc80;
  LinTerms *c_00;
  undefined1 local_328 [60];
  Var local_2ec;
  undefined8 local_2e8;
  undefined4 local_2dc;
  undefined1 local_2d8 [60];
  Var local_29c;
  undefined8 local_298;
  Var local_28c;
  Var local_250;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 *local_240;
  undefined8 local_238;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  Var local_28;
  undefined1 local_21;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_21 = 0;
  c_00 = in_RDI;
  local_20 = in_ECX;
  local_1c = in_EDX;
  LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffffc40);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RSI);
  local_200 = 0x3ff0000000000000;
  local_1f8 = 0x3ff0000000000000;
  local_1f0 = &local_200;
  local_1e8 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x1db802);
  __l._M_array._4_4_ = in_stack_fffffffffffffc7c;
  __l._M_array._0_4_ = in_stack_fffffffffffffc78;
  __l._M_len = in_stack_fffffffffffffc80;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffc70,__l,(allocator_type *)in_stack_fffffffffffffc68);
  local_248 = local_1c;
  local_244 = local_20;
  local_240 = &local_248;
  local_238 = 2;
  std::allocator<int>::allocator((allocator<int> *)0x1db873);
  __l_00._M_array._4_4_ = in_stack_fffffffffffffc7c;
  __l_00._M_array._0_4_ = in_stack_fffffffffffffc78;
  __l_00._M_len = in_stack_fffffffffffffc80;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,__l_00,
             (allocator_type *)in_stack_fffffffffffffc68);
  LinTerms::LinTerms(in_RSI,(vector<double,_std::allocator<double>_> *)c_00,
                     (vector<int,_std::allocator<int>_> *)in_RDI);
  AlgebraicExpression<mp::LinTerms>::AlgebraicExpression
            (in_stack_fffffffffffffc50,
             (LinTerms *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             (double)in_stack_fffffffffffffc40);
  LinearFunctionalConstraint::LinearFunctionalConstraint
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  VVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::AssignResultVar2Args<mp::LinearFunctionalConstraint>
                    (in_stack_fffffffffffffc68,
                     (LinearFunctionalConstraint *)
                     CONCAT44(in_stack_fffffffffffffc64._M_elems[0],in_stack_fffffffffffffc60));
  LinearFunctionalConstraint::~LinearFunctionalConstraint(in_stack_fffffffffffffc40);
  AlgebraicExpression<mp::LinTerms>::~AlgebraicExpression
            ((AlgebraicExpression<mp::LinTerms> *)0x1db91c);
  LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffffc40);
  iVar3 = (int)((ulong)in_stack_fffffffffffffc40 >> 0x20);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc50);
  std::allocator<int>::~allocator((allocator<int> *)0x1db943);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc50);
  std::allocator<double>::~allocator((allocator<double> *)0x1db95d);
  local_28 = VVar1;
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                        *)in_RSI);
  local_28c = local_28;
  local_298 = 0x4000000000000000;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  ::CustomFunctionalConstraint
            ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
              *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc64,in_stack_fffffffffffffc58);
  VVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AssignResultVar2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
                    (this_00,(CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
                              *)CONCAT44(in_stack_fffffffffffffc64._M_elems[0],
                                         in_stack_fffffffffffffc60));
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  ::~CustomFunctionalConstraint
            ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
              *)0x1db9db);
  local_250 = VVar2;
  LinTerms::add_term(&in_stack_fffffffffffffc50->super_LinTerms,
                     (double)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),iVar3);
  this_01 = (LinTerms *)
            BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     *)in_RSI);
  local_2dc = local_1c;
  local_2e8 = 0x4000000000000000;
  prm._M_elems[0] = (_Type)local_2d8;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  ::CustomFunctionalConstraint
            ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
              *)this_01,in_stack_fffffffffffffc64,prm);
  args._M_elems[0] =
       (_Type)FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::
              AssignResultVar2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
                        (this_00,(CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
                                  *)CONCAT44(in_stack_fffffffffffffc64._M_elems[0],
                                             in_stack_fffffffffffffc60));
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  ::~CustomFunctionalConstraint
            ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
              *)0x1dba81);
  local_29c = (Var)args._M_elems[0];
  LinTerms::add_term(this_01,(double)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                     iVar3);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RSI);
  iVar3 = (int)((ulong)local_328 >> 0x20);
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  ::CustomFunctionalConstraint
            ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
              *)this_01,args,prm);
  VVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AssignResultVar2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
                    (this_00,(CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
                              *)CONCAT44(args._M_elems[0],in_stack_fffffffffffffc60));
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  ::~CustomFunctionalConstraint
            ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
              *)0x1dbb25);
  local_2ec = VVar2;
  LinTerms::add_term(this_01,(double)CONCAT44(VVar2,in_stack_fffffffffffffc48),iVar3);
  return c_00;
}

Assistant:

LinTerms LinearizeGeneralProduct(double c, int x, int y) {
    LinTerms lt;
    auto x_plus_y = GetMC().AssignResultVar2Args(
          LinearFunctionalConstraint{{  // = x+y
                                        { {1.0, 1.0}, {x, y} }, 0.0 }} );
    auto x_plus_y_pow2 = GetMC().AssignResultVar2Args(
          PowConstExpConstraint{  // no context as of now
                          VarArray1{x_plus_y}, {2.0} } );
    lt.add_term(0.5*c, x_plus_y_pow2);
    auto x_pow2 = GetMC().AssignResultVar2Args(
          PowConstExpConstraint{  // no context as of now
                          VarArray1{x}, {2.0} } );
    lt.add_term(-0.5*c, x_pow2);
    auto y_pow2 = GetMC().AssignResultVar2Args(
          PowConstExpConstraint{  // no context as of now
                          VarArray1{y}, {2.0} } );
    lt.add_term(-0.5*c, y_pow2);
    return lt;
  }